

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

string * METADemuxer::mplsTrackToSSIFName
                   (string *__return_storage_ptr__,string *mplsFileName,string *mplsNum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  char *pcVar10;
  undefined8 uVar11;
  ulong uVar12;
  string ssifExt;
  string mplsExt;
  string path;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  extractFilePath(&local_b0,mplsFileName);
  toNativeSeparators(&local_50,&local_b0);
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  cVar3 = getDirSeparator();
  lVar5 = std::__cxx11::string::rfind((char)&local_50,(ulong)(uint)(int)cVar3);
  if (lVar5 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_001a6047;
  }
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_50);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"STREAM","");
  uVar12 = 0xf;
  if (local_d0 != local_c0) {
    uVar12 = local_c0[0];
  }
  if (uVar12 < (ulong)(local_88 + local_c8)) {
    uVar12 = 0xf;
    if (local_90 != local_80) {
      uVar12 = local_80[0];
    }
    if (uVar12 < (ulong)(local_88 + local_c8)) goto LAB_001a5b19;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_001a5b19:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  puVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_f0.field_2._M_allocated_capacity = *puVar8;
    local_f0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_f0.field_2._M_allocated_capacity = *puVar8;
    local_f0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_f0._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  getDirSeparator();
  plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_f0,local_f0._M_string_length,0,'\x01');
  local_130 = &local_120;
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_120 = *puVar8;
    lStack_118 = plVar7[3];
  }
  else {
    local_120 = *puVar8;
    local_130 = (ulong *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SSIF","");
  uVar12 = 0xf;
  if (local_130 != &local_120) {
    uVar12 = local_120;
  }
  if (uVar12 < (ulong)(local_68 + local_128)) {
    uVar12 = 0xf;
    if (local_70 != local_60) {
      uVar12 = local_60[0];
    }
    if (uVar12 < (ulong)(local_68 + local_128)) goto LAB_001a5c6d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_001a5c6d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_70);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_110.field_2._M_allocated_capacity = *psVar9;
    local_110.field_2._8_8_ = puVar6[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar9;
    local_110._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_110._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  getDirSeparator();
  plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_110,local_110._M_string_length,0,'\x01');
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  paVar2 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  paVar1 = &local_110.field_2;
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  extractFileExt(&local_110,mplsFileName);
  strToLowerCase(&local_b0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_b0);
  pcVar10 = "sif";
  if (iVar4 == 0) {
    pcVar10 = "ssif";
  }
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,pcVar10,pcVar10 + (ulong)(iVar4 == 0) + 3);
  std::operator+(&local_f0,&local_50,mplsNum);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,".","");
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    uVar11 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_c8 + local_f0._M_string_length) {
    uVar12 = 0xf;
    if (local_d0 != local_c0) {
      uVar12 = local_c0[0];
    }
    if (uVar12 < local_c8 + local_f0._M_string_length) goto LAB_001a5f0c;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
  }
  else {
LAB_001a5f0c:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
  }
  local_130 = &local_120;
  puVar8 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar8) {
    local_120 = *puVar8;
    lStack_118 = puVar6[3];
  }
  else {
    local_120 = *puVar8;
    local_130 = (ulong *)*puVar6;
  }
  local_128 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    lVar5 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_001a6047:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string METADemuxer::mplsTrackToSSIFName(const std::string& mplsFileName, const std::string& mplsNum)
{
    string path = toNativeSeparators(extractFilePath(mplsFileName));
    const size_t tmp = path.find_last_of(getDirSeparator());
    if (tmp == string::npos)
        return {};
    path = path.substr(0, tmp + 1) + string("STREAM") + getDirSeparator() + string("SSIF") + getDirSeparator();

    const string mplsExt = strToLowerCase(extractFileExt(mplsFileName));
    const string ssifExt = mplsExt == "mpls" ? "ssif" : "sif";

    return path + mplsNum + string(".") + ssifExt;
}